

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::BuildNodeHierarchy
          (RenderSceneConverter *this,RenderSceneConverterEnv *env,XformNode *root)

{
  bool bVar1;
  __type _Var2;
  StageMetas *pSVar3;
  string *psVar4;
  vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *this_00;
  size_type sVar5;
  string local_258;
  int local_238;
  allocator local_231;
  string local_230;
  undefined1 local_210 [8];
  Node root_node;
  XformNode *rootNode;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *__range2;
  string defaultRootNode;
  XformNode *root_local;
  RenderSceneConverterEnv *env_local;
  RenderSceneConverter *this_local;
  
  defaultRootNode.field_2._8_8_ = root;
  pSVar3 = Stage::metas(env->stage);
  psVar4 = Token::str_abi_cxx11_(&pSVar3->defaultPrim);
  ::std::__cxx11::string::string((string *)&__range2,(string *)psVar4);
  this->default_node = -1;
  this_00 = (vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *)
            (defaultRootNode.field_2._8_8_ + 0x108);
  __end2 = ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
           begin(this_00);
  rootNode = (XformNode *)
             ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>
             ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_tinyusdz::tydra::XformNode_*,_std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>_>
                                     *)&rootNode), bVar1) {
    root_node.handle =
         (uint64_t)
         __gnu_cxx::
         __normal_iterator<const_tinyusdz::tydra::XformNode_*,_std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>_>
         ::operator*(&__end2);
    Node::Node((Node *)local_210);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_230,"",&local_231);
    bVar1 = BuildNodeHierarchyImpl
                      (this,env,&local_230,(XformNode *)root_node.handle,(Node *)local_210);
    ::std::__cxx11::string::~string((string *)&local_230);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&__range2,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )root_node.handle);
      if (_Var2) {
        sVar5 = ::std::vector<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>::size
                          (&this->root_nodes);
        this->default_node = (int)sVar5;
      }
      ::std::operator+((char *)&local_258,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9de871
                      );
      sVar5 = ::std::vector<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>::size
                        (&this->root_nodes);
      StringAndIdMap::add(&this->root_nodeMap,&local_258,sVar5);
      ::std::__cxx11::string::~string((string *)&local_258);
      ::std::vector<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>::push_back
                (&this->root_nodes,(value_type *)local_210);
      local_238 = 0;
    }
    else {
      this_local._7_1_ = 0;
      local_238 = 1;
    }
    Node::~Node((Node *)local_210);
    if (local_238 != 0) goto LAB_004c9fc6;
    __gnu_cxx::
    __normal_iterator<const_tinyusdz::tydra::XformNode_*,_std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>_>
    ::operator++(&__end2);
  }
  this_local._7_1_ = 1;
  local_238 = 1;
LAB_004c9fc6:
  ::std::__cxx11::string::~string((string *)&__range2);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RenderSceneConverter::BuildNodeHierarchy(
    const RenderSceneConverterEnv &env, const XformNode &root) {
  std::string defaultRootNode = env.stage.metas().defaultPrim.str();

  default_node = -1;

  for (const auto &rootNode : root.children) {
    Node root_node;
    if (!BuildNodeHierarchyImpl(env, /* root */ "", rootNode, root_node)) {
      return false;
    }

    if (defaultRootNode == rootNode.element_name) {
      default_node = int(root_nodes.size());
    }

    root_nodeMap.add("/" + rootNode.element_name, root_nodes.size());
    root_nodes.push_back(root_node);
  }

  return true;
}